

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O0

void __thiscall nuraft::buffer_serializer::put_i16(buffer_serializer *this,int16_t val)

{
  bool bVar1;
  byte bVar2;
  overflow_error *this_00;
  byte *pbVar3;
  undefined2 in_SI;
  buffer_serializer *in_RDI;
  uint8_t *ptr;
  buffer_serializer *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe8;
  undefined6 in_stack_fffffffffffffff0;
  
  bVar1 = is_valid(in_stack_ffffffffffffffd8,(size_t)in_RDI);
  if (!bVar1) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"not enough space");
    __cxa_throw(this_00,&std::overflow_error::typeinfo,std::overflow_error::~overflow_error);
  }
  pbVar3 = nuraft::buffer::data_begin(in_RDI->buf_);
  pbVar3 = pbVar3 + in_RDI->pos_;
  bVar2 = (byte)((ushort)in_SI >> 8);
  if (in_RDI->endian_ == LITTLE) {
    *pbVar3 = (byte)in_SI;
    pbVar3[1] = bVar2;
  }
  else {
    pbVar3[1] = (byte)in_SI;
    *pbVar3 = bVar2;
  }
  pos(in_RDI);
  pos((buffer_serializer *)CONCAT26(in_SI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void buffer_serializer::put_i16(int16_t val) {
    chk_length(val);
    uint8_t* ptr = buf_.data_begin() + pos_;
    if (endian_ == LITTLE)  { put16l(val, ptr); }
    else                    { put16b(val, ptr); }
    pos( pos() + sizeof(val) );
}